

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

Inst * __thiscall mir::inst::LoadOffsetInst::deep_copy(LoadOffsetInst *this)

{
  LoadOffsetInst *this_00;
  VarId local_60;
  Value local_50;
  Value local_30;
  
  this_00 = (LoadOffsetInst *)operator_new(0x58);
  Value::Value(&local_30,&this->src);
  local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_60.id = (this->super_Inst).dest.id;
  Value::Value(&local_50,&this->offset);
  LoadOffsetInst(this_00,&local_30,&local_60,&local_50);
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new LoadOffsetInst(src, dest, offset); }